

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  uint uVar1;
  u8 uVar2;
  u32 uVar3;
  i16 *data;
  i16 *piVar4;
  bool bVar5;
  char *local_b8;
  int local_ac;
  Expr *pEStack_a8;
  int iCol;
  Expr *pColExpr;
  ExprList_item *pCollide;
  ExprList_item *pX;
  Table *pTab;
  Hash ht;
  char *pcStack_68;
  int nName;
  char *zName;
  Column *pCStack_58;
  int nCol;
  Column *pCol;
  Column *aCol;
  uint local_40;
  u32 cnt;
  int j;
  int i;
  sqlite3 *db;
  Column **paCol_local;
  i16 *pnCol_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  _j = pParse->db;
  db = (sqlite3 *)paCol;
  paCol_local = (Column **)pnCol;
  pnCol_local = (i16 *)pEList;
  pEList_local = (ExprList *)pParse;
  sqlite3HashInit((Hash *)&pTab);
  if (pnCol_local == (i16 *)0x0) {
    zName._4_4_ = 0;
    pCol = (Column *)0x0;
  }
  else {
    zName._4_4_ = *(int *)pnCol_local;
    pCol = (Column *)sqlite3DbMallocZero(_j,(long)zName._4_4_ << 4);
    if (0x7fff < zName._4_4_) {
      zName._4_4_ = 0x7fff;
    }
  }
  *(short *)paCol_local = (short)zName._4_4_;
  db->pVfs = (sqlite3_vfs *)pCol;
  cnt = 0;
  pCStack_58 = pCol;
  while( true ) {
    bVar5 = false;
    if ((int)cnt < zName._4_4_) {
      bVar5 = *(int *)&pEList_local[1].a[0].zEName == 0;
    }
    if (!bVar5) break;
    data = pnCol_local + (long)(int)cnt * 0xc + 4;
    pcStack_68 = *(char **)(data + 4);
    if ((pcStack_68 == (char *)0x0) || ((*(ushort *)((long)data + 0x11) & 3) != 0)) {
      pEStack_a8 = sqlite3ExprSkipCollateAndLikely(*(Expr **)data);
      while( true ) {
        bVar5 = false;
        if (pEStack_a8 != (Expr *)0x0) {
          bVar5 = pEStack_a8->op == 0x8d;
        }
        if (!bVar5) break;
        pEStack_a8 = pEStack_a8->pRight;
      }
      if (((pEStack_a8->op == 0xa7) && ((pEStack_a8->flags & 0x3000000) == 0)) &&
         ((pEStack_a8->y).pTab != (Table *)0x0)) {
        local_ac = (int)pEStack_a8->iColumn;
        if (local_ac < 0) {
          local_ac = (int)((pEStack_a8->y).pTab)->iPKey;
        }
        if (local_ac < 0) {
          local_b8 = "rowid";
        }
        else {
          local_b8 = ((pEStack_a8->y).pTab)->aCol[local_ac].zCnName;
        }
        pcStack_68 = local_b8;
      }
      else if (pEStack_a8->op == ';') {
        pcStack_68 = (pEStack_a8->u).zToken;
      }
    }
    if ((pcStack_68 == (char *)0x0) || (uVar3 = sqlite3IsTrueOrFalse(pcStack_68), uVar3 != 0)) {
      pcStack_68 = sqlite3MPrintf(_j,"column%d",(ulong)(cnt + 1));
    }
    else {
      pcStack_68 = sqlite3DbStrDup(_j,pcStack_68);
    }
    aCol._4_4_ = 0;
    while( true ) {
      bVar5 = false;
      if (pcStack_68 != (char *)0x0) {
        pColExpr = (Expr *)sqlite3HashFind((Hash *)&pTab,pcStack_68);
        bVar5 = pColExpr != (Expr *)0x0;
      }
      if (!bVar5) break;
      if ((*(ushort *)((long)&pColExpr->pLeft + 1) >> 7 & 1) != 0) {
        pCStack_58->colFlags = pCStack_58->colFlags | 0x400;
      }
      ht.ht._4_4_ = sqlite3Strlen30(pcStack_68);
      uVar1 = ht.ht._4_4_;
      if (0 < (int)ht.ht._4_4_) {
        do {
          local_40 = uVar1 - 1;
          bVar5 = false;
          if (0 < (int)local_40) {
            bVar5 = (""[(byte)pcStack_68[(int)local_40]] & 4) != 0;
          }
          uVar1 = local_40;
        } while (bVar5);
        if (pcStack_68[(int)local_40] == ':') {
          ht.ht._4_4_ = local_40;
        }
      }
      aCol._4_4_ = aCol._4_4_ + 1;
      pcStack_68 = sqlite3MPrintf(_j,"%.*z:%u",(ulong)ht.ht._4_4_,pcStack_68);
      sqlite3ProgressCheck((Parse *)pEList_local);
      if (3 < aCol._4_4_) {
        sqlite3_randomness(4,(void *)((long)&aCol + 4));
      }
    }
    pCStack_58->zCnName = pcStack_68;
    uVar2 = sqlite3StrIHash(pcStack_68);
    pCStack_58->hName = uVar2;
    if ((*(ushort *)((long)data + 0x11) >> 8 & 1) != 0) {
      pCStack_58->colFlags = pCStack_58->colFlags | 0x400;
    }
    if ((pcStack_68 != (char *)0x0) &&
       (piVar4 = (i16 *)sqlite3HashInsert((Hash *)&pTab,pcStack_68,data), piVar4 == data)) {
      sqlite3OomFault(_j);
    }
    cnt = cnt + 1;
    pCStack_58 = pCStack_58 + 1;
  }
  sqlite3HashClear((Hash *)&pTab);
  if (*(int *)&pEList_local[1].a[0].zEName == 0) {
    pParse_local._4_4_ = (anon_struct_4_9_b482b7ef_for_fg)0x0;
  }
  else {
    for (local_40 = 0; (int)local_40 < (int)cnt; local_40 = local_40 + 1) {
      sqlite3DbFree(_j,pCol[(int)local_40].zCnName);
    }
    sqlite3DbFree(_j,pCol);
    db->pVfs = (sqlite3_vfs *)0x0;
    *(undefined2 *)paCol_local = 0;
    pParse_local._4_4_ = pEList_local->a[0].fg;
  }
  return (int)pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !pParse->nErr; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      sqlite3ProgressCheck(pParse);
      if( cnt>3 ){
        sqlite3_randomness(sizeof(cnt), &cnt);
      }
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( pParse->nErr ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return pParse->rc;
  }
  return SQLITE_OK;
}